

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SizeT ARMT_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  int iVar1;
  uint local_34;
  UInt32 src;
  UInt32 dest;
  SizeT i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  
  if (size < 4) {
    data_local = (Byte *)0x0;
  }
  else {
    for (_src = (Byte *)0x0; _src <= (Byte *)(size - 4); _src = _src + 2) {
      if ((((data + 1)[(long)_src] & 0xf8) == 0xf0) && (((data + 3)[(long)_src] & 0xf8) == 0xf8)) {
        if (encoding == 0) {
          iVar1 = -(ip + 4 + (int)_src);
        }
        else {
          iVar1 = ip + 4 + (int)_src;
        }
        local_34 = iVar1 + (((data + 1)[(long)_src] & 7) << 0x13 | (uint)data[(long)_src] << 0xb |
                            ((data + 3)[(long)_src] & 7) << 8 | (uint)(data + 2)[(long)_src]) * 2;
        (data + 1)[(long)_src] = (byte)(local_34 >> 0x14) & 7 | 0xf0;
        data[(long)_src] = (Byte)(local_34 >> 0xc);
        (data + 3)[(long)_src] = (byte)((local_34 >> 1) >> 8) & 7 | 0xf8;
        (data + 2)[(long)_src] = (Byte)(local_34 >> 1);
        _src = _src + 2;
      }
    }
    data_local = _src;
  }
  return (SizeT)data_local;
}

Assistant:

static SizeT ARMT_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  ip += 4;
  for (i = 0; i <= size; i += 2)
  {
    if ((data[i + 1] & 0xF8) == 0xF0 &&
        (data[i + 3] & 0xF8) == 0xF8)
    {
      UInt32 dest;
      UInt32 src =
        (((UInt32)data[i + 1] & 0x7) << 19) |
        ((UInt32)data[i + 0] << 11) |
        (((UInt32)data[i + 3] & 0x7) << 8) |
        (data[i + 2]);
      
      src <<= 1;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      dest >>= 1;
      
      data[i + 1] = (Byte)(0xF0 | ((dest >> 19) & 0x7));
      data[i + 0] = (Byte)(dest >> 11);
      data[i + 3] = (Byte)(0xF8 | ((dest >> 8) & 0x7));
      data[i + 2] = (Byte)dest;
      i += 2;
    }
  }
  return i;
}